

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O3

void reportLpObjSense(HighsLogOptions *log_options,HighsLp *lp)

{
  char *format;
  
  if (lp->sense_ == kMaximize) {
    format = "Objective sense is maximize\n";
  }
  else {
    if (lp->sense_ != kMinimize) {
      highsLogUser(log_options,kInfo,"Objective sense is ill-defined as %d\n");
      return;
    }
    format = "Objective sense is minimize\n";
  }
  highsLogUser(log_options,kInfo,format);
  return;
}

Assistant:

void reportLpObjSense(const HighsLogOptions& log_options, const HighsLp& lp) {
  if (lp.sense_ == ObjSense::kMinimize)
    highsLogUser(log_options, HighsLogType::kInfo,
                 "Objective sense is minimize\n");
  else if (lp.sense_ == ObjSense::kMaximize)
    highsLogUser(log_options, HighsLogType::kInfo,
                 "Objective sense is maximize\n");
  else
    highsLogUser(log_options, HighsLogType::kInfo,
                 "Objective sense is ill-defined as %" HIGHSINT_FORMAT "\n",
                 lp.sense_);
}